

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondTypeParser.cpp
# Opt level: O1

BondType * __thiscall
OpenMD::BondTypeParser::parseLine(BondTypeParser *this,string *line,RealType kScale)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  int iVar3;
  int myMatt;
  iterator iVar4;
  undefined8 *puVar5;
  mapped_type_conflict *pmVar6;
  ShiftedMieBondType *this_00;
  OpenMDException *pOVar7;
  _Rb_tree_color _Var8;
  RealType RVar9;
  StringTokenizer tokenizer;
  string local_d0;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  StringTokenizer local_90;
  RealType local_38;
  
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_90,line,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  uVar2 = StringTokenizer::countTokens(&local_90);
  if (0 < (int)uVar2) {
    StringTokenizer::nextToken_abi_cxx11_(&local_d0,&local_90);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
                    *)this,&local_d0);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header) {
      _Var8 = 7;
    }
    else {
      _Var8 = iVar4._M_node[2]._M_color;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    switch(_Var8) {
    case _S_red:
      if (uVar2 == 1) {
        pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"BondTypeParser: Not enough tokens","");
        OpenMDException::OpenMDException(pOVar7,&local_d0);
        __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_90);
      this_00 = (ShiftedMieBondType *)operator_new(0x10);
      (this_00->super_BondType).r0 = RVar9;
      (this_00->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_00300e10;
      break;
    case _S_black:
      if ((int)uVar2 < 3) {
        pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"BondTypeParser: Not enough tokens","");
        OpenMDException::OpenMDException(pOVar7,&local_d0);
        __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_90);
      this_00 = (ShiftedMieBondType *)operator_new(0x18);
      (this_00->super_BondType).r0 = local_b0;
      (this_00->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_00300b68;
      this_00->sigma = local_a8 * kScale;
      break;
    case 2:
      if ((int)uVar2 < 6) {
        pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"BondTypeParser: Not enough tokens","");
        OpenMDException::OpenMDException(pOVar7,&local_d0);
        __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_98 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_90);
      this_00 = (ShiftedMieBondType *)operator_new(0x30);
      (this_00->super_BondType).r0 = RVar9;
      (this_00->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_00300e38;
      this_00->sigma = local_b0;
      this_00->epsilon = local_a8;
      *(RealType *)&this_00->n = local_98;
      this_00->nmScale_ = local_a0;
      break;
    case 3:
      if ((int)uVar2 < 7) {
        pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"BondTypeParser: Not enough tokens","");
        OpenMDException::OpenMDException(pOVar7,&local_d0);
        __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_98 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_38 = StringTokenizer::nextTokenAsDouble(&local_90);
      this_00 = (ShiftedMieBondType *)operator_new(0x38);
      (this_00->super_BondType).r0 = RVar9;
      (this_00->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_00300e78;
      this_00->sigma = local_b0;
      this_00->epsilon = local_a8;
      *(RealType *)&this_00->n = local_98;
      this_00->nmScale_ = local_a0;
      this_00->rS_ = local_38;
      break;
    case 4:
      if (((int)uVar2 < 4) || ((uVar2 & 1) != 0)) {
        pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"BondTypeParser: Not enough tokens","");
        OpenMDException::OpenMDException(pOVar7,&local_d0);
        __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_90);
      puVar5 = (undefined8 *)operator_new(0x40);
      puVar5[1] = RVar9;
      *puVar5 = &PTR__PolynomialBondType_00300eb8;
      *(undefined4 *)(puVar5 + 3) = 0;
      this_00 = (ShiftedMieBondType *)0x0;
      puVar5[4] = 0;
      puVar5[5] = puVar5 + 3;
      puVar5[6] = puVar5 + 3;
      puVar5[7] = 0;
      if (uVar2 - 2 != 0) {
        uVar2 = uVar2 - 2 >> 1;
        this_00 = (ShiftedMieBondType *)0x0;
        do {
          iVar3 = StringTokenizer::nextTokenAsInt(&local_90);
          RVar9 = StringTokenizer::nextTokenAsDouble(&local_90);
          local_d0._M_dataplus._M_p._0_4_ = iVar3;
          pmVar6 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)(puVar5 + 2),(key_type *)&local_d0);
          *pmVar6 = RVar9;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
      break;
    case 5:
      if ((int)uVar2 < 4) {
        pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"BondTypeParser: Not enough tokens","");
        OpenMDException::OpenMDException(pOVar7,&local_d0);
        __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_90);
      this_00 = (ShiftedMieBondType *)operator_new(0x20);
      (this_00->super_BondType).r0 = RVar9;
      (this_00->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_00300ef8;
      this_00->sigma = local_b0;
      this_00->epsilon = local_a8;
      break;
    case 6:
      if ((int)uVar2 < 5) {
        pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"BondTypeParser: Not enough tokens","");
        OpenMDException::OpenMDException(pOVar7,&local_d0);
        __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_90);
      iVar3 = StringTokenizer::nextTokenAsInt(&local_90);
      myMatt = StringTokenizer::nextTokenAsInt(&local_90);
      this_00 = (ShiftedMieBondType *)operator_new(0x40);
      ShiftedMieBondType::ShiftedMieBondType(this_00,RVar9,local_b0,iVar3,myMatt);
      break;
    default:
      pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"BondTypeParser: Unknown Bond Type","");
      OpenMDException::OpenMDException(pOVar7,&local_d0);
      __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.delim_._M_dataplus._M_p != &local_90.delim_.field_2) {
      operator_delete(local_90.delim_._M_dataplus._M_p,
                      local_90.delim_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.tokenString_._M_dataplus._M_p != &local_90.tokenString_.field_2) {
      operator_delete(local_90.tokenString_._M_dataplus._M_p,
                      local_90.tokenString_.field_2._M_allocated_capacity + 1);
    }
    return &this_00->super_BondType;
  }
  pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"BondTypeParser: Not enough tokens","");
  OpenMDException::OpenMDException(pOVar7,&local_d0);
  __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

BondType* BondTypeParser::parseLine(const std::string& line,
                                      RealType kScale) {
    StringTokenizer tokenizer(line);
    BondType* bondType = NULL;
    int nTokens        = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("BondTypeParser: Not enough tokens");
    }

    BondTypeEnum bt = getBondTypeEnum(tokenizer.nextToken());
    nTokens -= 1;

    switch (bt) {
    case btFixed:
      if (nTokens < 1) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        bondType    = new FixedBondType(b0);
      }
      break;

    case btHarmonic:
      if (nTokens < 2) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType kb = tokenizer.nextTokenAsDouble();
        kb *= kScale;
        bondType = new HarmonicBondType(b0, kb);
      }
      break;

    case btCubic:
      if (nTokens < 5) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bondType = new CubicBondType(b0, k3, k2, k1, k0);
      }
      break;

    case btQuartic:
      if (nTokens < 6) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bondType = new QuarticBondType(b0, k4, k3, k2, k1, k0);
      }
      break;

    case btPolynomial:

      if (nTokens < 3 || nTokens % 2 != 1) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        nTokens -= 1;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        PolynomialBondType* pbt = new PolynomialBondType(b0);

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble();
          pbt->setCoefficient(power, coefficient);
        }
      }

      break;

    case btMorse:
      if (nTokens < 3) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0   = tokenizer.nextTokenAsDouble();
        RealType D    = tokenizer.nextTokenAsDouble();
        RealType beta = tokenizer.nextTokenAsDouble();
        bondType      = new MorseBondType(b0, D, beta);
      }
      break;

    case btShiftedMie:
      if (nTokens < 4) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType sigma   = tokenizer.nextTokenAsDouble();
        RealType epsilon = tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();

        bondType = new ShiftedMieBondType(sigma, epsilon, nRep, mAtt);
      }
      break;

    case btUnknown:
    default:
      throw OpenMDException("BondTypeParser: Unknown Bond Type");
    }

    return bondType;
  }